

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

bool __thiscall tinygltf::Asset::operator==(Asset *this,Asset *other)

{
  __type _Var1;
  bool bVar2;
  
  _Var1 = std::operator==(&this->copyright,&other->copyright);
  if (_Var1) {
    bVar2 = std::operator==(&(this->extensions)._M_t,&(other->extensions)._M_t);
    if (bVar2) {
      bVar2 = Equals(&this->extras,&other->extras);
      if (bVar2) {
        _Var1 = std::operator==(&this->generator,&other->generator);
        if (_Var1) {
          _Var1 = std::operator==(&this->minVersion,&other->minVersion);
          if (_Var1) {
            _Var1 = std::operator==(&this->version,&other->version);
            return _Var1;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Asset::operator==(const Asset &other) const {
  return this->copyright == other.copyright &&
         this->extensions == other.extensions && this->extras == other.extras &&
         this->generator == other.generator &&
         this->minVersion == other.minVersion && this->version == other.version;
}